

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMpsFF.cpp
# Opt level: O3

Parsekey __thiscall
free_format_parser::HMpsFF::parseHessian
          (HMpsFF *this,HighsLogOptions *log_options,istream *file,Parsekey keyword)

{
  byte bVar1;
  bool bVar2;
  Parsekey PVar3;
  int iVar4;
  HighsInt HVar5;
  long lVar6;
  size_t start;
  pointer start_00;
  HighsInt id;
  char *pcVar7;
  HMpsFF *this_00;
  double dVar8;
  pointer pcVar9;
  bool is_nan;
  bool skip;
  string coeff_name;
  string row_name;
  string col_name;
  size_t begin;
  string section_name;
  string strline;
  bool local_132;
  bool local_131;
  Parsekey local_130;
  HighsInt local_12c;
  HighsLogOptions *local_128;
  Parsekey local_11c;
  HMpsFF *local_118;
  HMpsFF *local_110;
  pointer local_108;
  string local_100;
  string local_e0;
  undefined1 local_c0 [8];
  char *local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  string local_a0;
  undefined8 local_80;
  size_t local_78;
  undefined1 local_70 [16];
  undefined1 local_60 [16];
  string local_50;
  
  local_70._0_8_ = local_60;
  local_70._8_8_ = (pointer)0x0;
  local_60[0] = 0;
  local_128 = log_options;
  if (keyword == kQmatrix) {
    pcVar7 = "QMATRIX";
  }
  else {
    this_00 = this;
    if (keyword != kQuadobj) goto LAB_001f7a0e;
    pcVar7 = "QUADOBJ";
  }
  this_00 = (HMpsFF *)local_70;
  std::__cxx11::string::_M_replace((ulong)this_00,0,(char *)0x0,(ulong)pcVar7);
LAB_001f7a0e:
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  local_a0._M_string_length = 0;
  local_a0.field_2._M_local_buf[0] = '\0';
  local_c0 = (undefined1  [8])&local_b0;
  local_b8 = (char *)0x0;
  local_b0._M_local_buf[0] = '\0';
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  local_e0._M_string_length = 0;
  local_e0.field_2._M_local_buf[0] = '\0';
  local_118 = (HMpsFF *)&this->q_entries;
  local_11c = keyword;
  local_110 = this;
  local_80 = file;
  do {
    do {
      bVar2 = getMpsLine(this_00,file,&local_50,&local_131);
      local_130 = kFail;
      if (!bVar2) {
LAB_001f7d55:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p);
        }
        if (local_c0 != (undefined1  [8])&local_b0) {
          operator_delete((void *)local_c0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        if ((undefined1 *)local_70._0_8_ != local_60) {
          operator_delete((void *)local_70._0_8_);
        }
        return local_130;
      }
    } while (local_131 != false);
    if ((0.0 < this->time_limit_) &&
       (lVar6 = std::chrono::_V2::system_clock::now(),
       dVar8 = (double)lVar6 / 1000000000.0 - this->start_time,
       this->time_limit_ <= dVar8 && dVar8 != this->time_limit_)) {
      local_130 = kTimeout;
      goto LAB_001f7d55;
    }
    local_78 = 0;
    local_108 = (pointer)0x0;
    PVar3 = checkFirstWord(this,&local_50,&local_78,(size_t *)&local_108,&local_a0);
    if (PVar3 != kNone) {
      highsLogDev(local_128,kInfo,"readMPS: Read %s OK\n",local_70._0_8_);
      local_130 = PVar3;
      goto LAB_001f7d55;
    }
    local_12c = getColIdx(this,&local_a0,true);
    bVar1 = 1;
    start_00 = local_108;
    do {
      std::__cxx11::string::_M_replace((ulong)local_c0,0,local_b8,0x3cbf27);
      first_word(&local_100,&local_50,(size_t)start_00);
      std::__cxx11::string::operator=((string *)local_c0,(string *)&local_100);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p);
      }
      start = first_word_end(&local_50,(size_t)start_00);
      this_00 = (HMpsFF *)local_c0;
      iVar4 = std::__cxx11::string::compare((char *)local_c0);
      this = local_110;
      file = (istream *)local_80;
      if (iVar4 == 0) break;
      id = 0x3cbf27;
      std::__cxx11::string::_M_replace
                ((ulong)&local_e0,0,(char *)local_e0._M_string_length,0x3cbf27);
      first_word(&local_100,&local_50,start);
      std::__cxx11::string::operator=((string *)&local_e0,(string *)&local_100);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p);
      }
      start_00 = (pointer)first_word_end(&local_50,start);
      iVar4 = std::__cxx11::string::compare((char *)&local_e0);
      if (iVar4 == 0) {
        trim((string *)local_c0,&default_non_chars_abi_cxx11_);
        trim(&local_a0,&default_non_chars_abi_cxx11_);
        highsLogUser(local_128,kError,"%s has no coefficient for entry \"%s\" in column \"%s\"\n",
                     local_70._0_8_,local_c0,local_a0._M_dataplus._M_p);
        goto LAB_001f7d55;
      }
      this_00 = local_110;
      HVar5 = getColIdx(local_110,(string *)local_c0,true);
      local_132 = false;
      pcVar9 = (pointer)getValue(this_00,&local_e0,&local_132,id);
      if (local_132 == true) {
        highsLogUser(local_128,kError,
                     "Hessian coefficient for entry \"%s\" in column \"%s\" is NaN\n",local_c0,
                     local_a0._M_dataplus._M_p);
        goto LAB_001f7d55;
      }
      if (((double)pcVar9 != 0.0) || (NAN((double)pcVar9))) {
        if (local_11c == kQmatrix) {
          if (local_12c <= HVar5) {
            local_100._M_string_length._0_4_ = local_12c;
            this_00 = local_118;
            local_100._M_dataplus._M_p = pcVar9;
            local_100._M_string_length._4_4_ = HVar5;
            std::vector<std::tuple<int,int,double>,std::allocator<std::tuple<int,int,double>>>::
            emplace_back<std::tuple<int,int,double>>
                      ((vector<std::tuple<int,int,double>,std::allocator<std::tuple<int,int,double>>>
                        *)local_118,(tuple<int,_int,_double> *)&local_100);
          }
        }
        else {
          local_100._M_string_length._0_4_ = local_12c;
          this_00 = local_118;
          local_100._M_dataplus._M_p = pcVar9;
          local_100._M_string_length._4_4_ = HVar5;
          std::vector<std::tuple<int,int,double>,std::allocator<std::tuple<int,int,double>>>::
          emplace_back<std::tuple<int,int,double>>
                    ((vector<std::tuple<int,int,double>,std::allocator<std::tuple<int,int,double>>>
                      *)local_118,(tuple<int,_int,_double> *)&local_100);
        }
      }
      bVar2 = (bool)(start_00 != (pointer)local_50._M_string_length & bVar1);
      bVar1 = 0;
      this = local_110;
      file = (istream *)local_80;
    } while (bVar2);
  } while( true );
}

Assistant:

typename HMpsFF::Parsekey HMpsFF::parseHessian(
    const HighsLogOptions& log_options, std::istream& file,
    const HMpsFF::Parsekey keyword) {
  // Parse Hessian information from QUADOBJ or QMATRIX
  // section according to keyword
  const bool qmatrix = keyword == HMpsFF::Parsekey::kQmatrix;
  std::string section_name;
  if (qmatrix) {
    section_name = "QMATRIX";
  } else if (keyword == HMpsFF::Parsekey::kQuadobj) {
    section_name = "QUADOBJ";
  }
  std::string strline;
  std::string col_name;
  std::string row_name;
  std::string coeff_name;
  size_t end_row_name;
  size_t end_coeff_name;
  HighsInt colidx, rowidx;

  bool skip;
  while (getMpsLine(file, strline, skip)) {
    if (skip) continue;
    if (timeout()) return HMpsFF::Parsekey::kTimeout;

    size_t begin = 0;
    size_t end = 0;
    HMpsFF::Parsekey key = checkFirstWord(strline, begin, end, col_name);

    // start of new section?
    if (key != Parsekey::kNone) {
      highsLogDev(log_options, HighsLogType::kInfo, "readMPS: Read %s OK\n",
                  section_name.c_str());
      return key;
    }

    // Get the column index from the name
    colidx = getColIdx(col_name);
    assert(colidx >= 0 && colidx < num_col);

    // Loop over the maximum of two entries per row of the file
    for (int entry = 0; entry < 2; entry++) {
      // Get the row name
      row_name = "";
      row_name = first_word(strline, end);
      end_row_name = first_word_end(strline, end);

      if (row_name == "") break;

      coeff_name = "";
      coeff_name = first_word(strline, end_row_name);
      end_coeff_name = first_word_end(strline, end_row_name);

      if (coeff_name == "") {
        trim(row_name);
        trim(col_name);
        highsLogUser(
            log_options, HighsLogType::kError,
            "%s has no coefficient for entry \"%s\" in column \"%s\"\n",
            section_name.c_str(), row_name.c_str(), col_name.c_str());
        return HMpsFF::Parsekey::kFail;
      }

      rowidx = getColIdx(row_name);
      assert(rowidx >= 0 && rowidx < num_col);

      bool is_nan = false;
      double coeff = getValue(coeff_name, is_nan);  // atof(word.c_str());
      if (is_nan) {
        highsLogUser(
            log_options, HighsLogType::kError,
            "Hessian coefficient for entry \"%s\" in column \"%s\" is NaN\n",
            row_name.c_str(), col_name.c_str());
        return HMpsFF::Parsekey::kFail;
      }
      if (coeff) {
        if (qmatrix) {
          // QMATRIX has the whole Hessian, so store the entry if the
          // entry is in the lower triangle
          if (rowidx >= colidx)
            q_entries.push_back(std::make_tuple(rowidx, colidx, coeff));
        } else {
          // QSECTION and QUADOBJ has the lower triangle of the
          // Hessian
          q_entries.push_back(std::make_tuple(rowidx, colidx, coeff));
          //          if (rowidx != colidx)
          //            q_entries.push_back(std::make_tuple(colidx, rowidx,
          //            coeff));
        }
      }
      end = end_coeff_name;
      // Don't read more if end of line reached
      if (end == strline.length()) break;
    }
  }

  return HMpsFF::Parsekey::kFail;
}